

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase_locale.cpp
# Opt level: O0

int32_t ustrcase_getCaseLocale_63(char *locale)

{
  undefined8 local_18;
  char *locale_local;
  
  local_18 = locale;
  if (locale == (char *)0x0) {
    local_18 = uloc_getDefault_63();
  }
  if (*local_18 == '\0') {
    locale_local._4_4_ = 1;
  }
  else {
    locale_local._4_4_ = ucase_getCaseLocale_63(local_18);
  }
  return locale_local._4_4_;
}

Assistant:

U_CFUNC int32_t
ustrcase_getCaseLocale(const char *locale) {
    if (locale == NULL) {
        locale = uloc_getDefault();
    }
    if (*locale == 0) {
        return UCASE_LOC_ROOT;
    } else {
        return ucase_getCaseLocale(locale);
    }
}